

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternPainter.cpp
# Opt level: O0

int __thiscall PatternPainter::highlightIndex(PatternPainter *this,int rowno)

{
  int rowno_local;
  PatternPainter *this_local;
  
  if ((this->mHighlightInterval2 == 0) || (rowno % this->mHighlightInterval2 != 0)) {
    if ((this->mHighlightInterval1 == 0) || (rowno % this->mHighlightInterval1 != 0)) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

int PatternPainter::highlightIndex(int rowno) const {
    // this could probably be optimized better
    if (mHighlightInterval2 && rowno % mHighlightInterval2 == 0) {
        return 2;
    } else if (mHighlightInterval1 && rowno % mHighlightInterval1 == 0) {
        return 1;
    } else {
        return 0;
    }
}